

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool __thiscall
helics::TimeDependencies::checkIfAllDependenciesArePastExec(TimeDependencies *this,bool iterating)

{
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __first;
  byte bVar1;
  bool bVar2;
  const_iterator __last;
  const_iterator cVar3;
  byte in_SIL;
  TimeState minstate;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffffc8
  ;
  undefined1 local_22;
  undefined6 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  local_22 = 6;
  if (bVar1 == 0) {
    local_22 = 8;
  }
  __last = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                     (in_stack_ffffffffffffffc8);
  cVar3 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                    (in_stack_ffffffffffffffc8);
  __first._M_current._6_1_ = local_22;
  __first._M_current._0_6_ = in_stack_fffffffffffffff0;
  __first._M_current._7_1_ = bVar1;
  bVar2 = std::
          all_of<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::TimeDependencies::checkIfAllDependenciesArePastExec(bool)const::__0>
                    (__first,(__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                              )__last._M_current,
                     (anon_class_1_1_977a66fd)(TimeState)((ulong)cVar3._M_current >> 0x38));
  return bVar2;
}

Assistant:

bool TimeDependencies::checkIfAllDependenciesArePastExec(bool iterating) const
{
    auto minstate =
        iterating ? TimeState::time_requested_require_iteration : TimeState::time_requested;

    return std::all_of(dependencies.begin(), dependencies.end(), [minstate](const auto& dep) {
        return ((!dep.dependency) || (dep.connection == ConnectionType::SELF) ||
                (dep.mTimeState >= minstate) ||
                (dep.mTimeState == TimeState::time_granted && dep.next > timeZero));
    });

    /* return std::none_of(dependencies.begin(), dependencies.end(), [minstate](const auto& dep) {
         return (dep.dependency && dep.connection != ConnectionType::SELF &&
                 (dep.mTimeState < minstate));
     });*/
}